

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O0

void __thiscall
Assimp::IFC::anon_unknown_9::Conic::Conic(Conic *this,IfcConic *entity,ConversionData *conv)

{
  element_type *in;
  aiVector3t<double> *local_118;
  aiVector3t<double> local_110;
  aiVector3t<double> local_f8;
  aiVector3t<double> local_e0;
  aiVector3t<double> local_c8;
  undefined1 local_a0 [8];
  IfcMatrix4 trafo;
  ConversionData *conv_local;
  IfcConic *entity_local;
  Conic *this_local;
  
  trafo.d4 = (double)conv;
  Curve::Curve(&this->super_Curve,&entity->super_IfcCurve,conv);
  (this->super_Curve)._vptr_Curve = (_func_int **)&PTR__Conic_0110e130;
  aiVector3t<double>::aiVector3t(&this->location);
  local_118 = this->p;
  do {
    aiVector3t<double>::aiVector3t(local_118);
    local_118 = local_118 + 1;
  } while ((Conic *)local_118 != this + 1);
  aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)local_a0);
  in = std::
       __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
       ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&(entity->super_IfcCurve).field_0x40);
  ConvertAxisPlacement((aiMatrix4x4t<double> *)local_a0,in,(ConversionData *)trafo.d4);
  aiVector3t<double>::aiVector3t(&local_c8,trafo.a3,trafo.b3,trafo.c3);
  (this->location).z = local_c8.z;
  (this->location).x = local_c8.x;
  (this->location).y = local_c8.y;
  aiVector3t<double>::aiVector3t(&local_e0,(double)local_a0,trafo.a4,trafo.b4);
  this->p[0].z = local_e0.z;
  this->p[0].x = local_e0.x;
  this->p[0].y = local_e0.y;
  aiVector3t<double>::aiVector3t(&local_f8,trafo.a1,trafo.b1,trafo.c1);
  this->p[1].z = local_f8.z;
  this->p[1].x = local_f8.x;
  this->p[1].y = local_f8.y;
  aiVector3t<double>::aiVector3t(&local_110,trafo.a2,trafo.b2,trafo.c2);
  this->p[2].x = local_110.x;
  this->p[2].y = local_110.y;
  this->p[2].z = local_110.z;
  return;
}

Assistant:

Conic(const Schema_2x3::IfcConic& entity, ConversionData& conv)
    : Curve(entity,conv) {
        IfcMatrix4 trafo;
        ConvertAxisPlacement(trafo,*entity.Position,conv);

        // for convenience, extract the matrix rows
        location = IfcVector3(trafo.a4,trafo.b4,trafo.c4);
        p[0] = IfcVector3(trafo.a1,trafo.b1,trafo.c1);
        p[1] = IfcVector3(trafo.a2,trafo.b2,trafo.c2);
        p[2] = IfcVector3(trafo.a3,trafo.b3,trafo.c3);
    }